

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O1

void __thiscall QAbstractButton::mouseReleaseEvent(QAbstractButton *this,QMouseEvent *e)

{
  byte bVar1;
  long lVar2;
  QAbstractButtonPrivate *this_00;
  char cVar3;
  undefined4 uVar4;
  QMouseEvent QVar5;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(e + 0x40) == 1) {
    this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
    bVar1 = this_00->field_0x28c;
    this_00->field_0x28c = bVar1 & 0xbf;
    if ((bVar1 & 0x10) != 0) {
      uVar4 = QEventPoint::position();
      auVar7._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                     extraout_XMM1_Qa;
      auVar7._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                     extraout_XMM0_Qa;
      auVar7 = minpd(_DAT_0066f5d0,auVar7);
      auVar6._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
      auVar6._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
      movmskpd(uVar4,auVar6);
      cVar3 = (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this);
      if (cVar3 == '\0') {
        QVar5 = (QMouseEvent)0x0;
        setDown(this,false);
      }
      else {
        QBasicTimer::stop();
        QAbstractButtonPrivate::click(this_00);
        QVar5 = (QMouseEvent)0x1;
      }
      goto LAB_003c57b6;
    }
    if ((bVar1 & 0x20) == 0) {
      QWidget::update(*(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8);
    }
  }
  QVar5 = (QMouseEvent)0x0;
LAB_003c57b6:
  e[0xc] = QVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QAbstractButton);

    if (e->button() != Qt::LeftButton) {
        e->ignore();
        return;
    }

    d->pressed = false;

    if (!d->down) {
        // refresh is required by QMacStyle to resume the default button animation
        d->refresh();
        e->ignore();
        return;
    }

    if (hitButton(e->position().toPoint())) {
        d->repeatTimer.stop();
        d->click();
        e->accept();
    } else {
        setDown(false);
        e->ignore();
    }
}